

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void __thiscall FConsoleCommand::~FConsoleCommand(FConsoleCommand *this)

{
  this->_vptr_FConsoleCommand = (_func_int **)&PTR__FConsoleCommand_006f6188;
  *this->m_Prev = this->m_Next;
  if (this->m_Next != (FConsoleCommand *)0x0) {
    this->m_Next->m_Prev = this->m_Prev;
  }
  C_RemoveTabCommand(this->m_Name);
  if (this->m_Name != (char *)0x0) {
    operator_delete__(this->m_Name);
    return;
  }
  return;
}

Assistant:

FConsoleCommand::~FConsoleCommand ()
{
	*m_Prev = m_Next;
	if (m_Next)
		m_Next->m_Prev = m_Prev;
	C_RemoveTabCommand (m_Name);
	delete[] m_Name;
}